

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_script_from_miniscript
              (miniscript_node_t *node,miniscript_node_t *parent,uint32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  uint uVar1;
  int iVar2;
  char *path;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  int iVar8;
  size_t *astarisk_index_00;
  int8_t astarisk_index;
  size_t output_len;
  uint32_t count;
  uchar pubkey [33];
  uchar bip32_serialized [82];
  ext_key derive_extkey;
  uchar privkey [38];
  char local_631;
  size_t local_630;
  uint local_624;
  size_t *local_620;
  ext_key local_618;
  uchar local_558 [96];
  ext_key local_4f8;
  undefined4 local_438;
  char local_417;
  
  local_630 = 0;
  if (node->info != (miniscript_item_t *)0x0) {
    local_630 = *write_len;
    iVar4 = (*node->info->generate_function)
                      (node,parent,derive_child_num,script,script_len,&local_630);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_620 = write_len;
    if (node->wrapper != 0) {
      for (sVar5 = strlen(node->wrapper_str); sVar5 != 0; sVar5 = sVar5 - 1) {
        lVar6 = 0;
        do {
          if (**(char **)((long)&miniscript_wrapper_table[0].name + lVar6) ==
              node->wrapper_str[sVar5 - 1]) {
            lVar6 = (long)&miniscript_wrapper_table[0].name + lVar6;
            goto LAB_00169b06;
          }
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 400);
        lVar6 = 0;
LAB_00169b06:
        if (lVar6 == 0) {
          return -2;
        }
        iVar4 = (**(code **)(lVar6 + 0x20))(script,script_len,&local_630);
        if (iVar4 != 0) {
          return iVar4;
        }
      }
    }
    *local_620 = local_630;
    return 0;
  }
  uVar1 = node->kind;
  if (uVar1 == 0x1020 || (uVar1 & 4) != 0) {
    iVar4 = wally_hex_to_bytes(node->data,script,script_len,write_len);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (node->kind != 0x1020) {
      return 0;
    }
    if (*write_len == 0x20) {
      node->is_xonly_key = true;
      return 0;
    }
    if (*write_len != 0x41) {
      return 0;
    }
    node->is_uncompress_key = true;
    return 0;
  }
  if ((int)uVar1 < 0x210) {
    if (uVar1 == 8) {
      iVar4 = generate_script_from_number(node->number,parent,script,script_len,write_len);
      return iVar4;
    }
    if (uVar1 == 0x110) {
LAB_00169bd8:
      iVar4 = analyze_miniscript_addr
                        (node->data,(miniscript_node_t *)0x0,(miniscript_node_t *)0x0,
                         (address_script_t *)0x0,script,script_len,write_len);
      return iVar4;
    }
  }
  else {
    if (uVar1 == 0x210) goto LAB_00169bd8;
    if (uVar1 == 0x2020) {
      iVar4 = 0;
      if (script_len < 0x41) {
        bVar3 = false;
      }
      else {
        iVar4 = wally_base58_to_bytes(node->data,1,(uchar *)&local_438,0x26,&local_630);
        if ((iVar4 == 0) && (local_630 < 0x21)) {
LAB_00169cb4:
          bVar3 = false;
          iVar4 = 0;
        }
        else {
          iVar4 = wally_ec_public_key_from_private_key
                            ((uchar *)((long)&local_438 + 1),0x20,local_618.chain_code,0x21);
          if (iVar4 == 0) {
            if ((node->network_type & 0xfffffffd) != 0) goto LAB_00169cb4;
            node->network_type = 2;
            if ((local_630 == 0x22) && (local_417 == '\x01')) {
              if (node->is_xonly_key == true) {
                *(ulong *)(script + 0x10) =
                     CONCAT17(local_618.chain_code[0x18],local_618.chain_code._17_7_);
                *(ulong *)(script + 0x18) =
                     CONCAT17(local_618.parent160[0],local_618.chain_code._25_7_);
                *(ulong *)script = CONCAT17(local_618.chain_code[8],local_618.chain_code._1_7_);
                *(ulong *)(script + 8) =
                     CONCAT17(local_618.chain_code[0x10],local_618.chain_code._9_7_);
                *write_len = 0x20;
              }
              else {
                script[0x20] = local_618.parent160[0];
                *(ulong *)(script + 0x10) =
                     CONCAT71(local_618.chain_code._17_7_,local_618.chain_code[0x10]);
                *(ulong *)(script + 0x18) =
                     CONCAT71(local_618.chain_code._25_7_,local_618.chain_code[0x18]);
                *(ulong *)script = CONCAT71(local_618.chain_code._1_7_,local_618.chain_code[0]);
                *(ulong *)(script + 8) =
                     CONCAT71(local_618.chain_code._9_7_,local_618.chain_code[8]);
                *write_len = 0x21;
              }
            }
            else {
              iVar4 = wally_ec_public_key_decompress(local_618.chain_code,0x21,script,0x41);
              if (iVar4 != 0) goto LAB_00169cdf;
              *write_len = 0x41;
              node->is_uncompress_key = true;
            }
            iVar4 = 0;
          }
LAB_00169cdf:
          bVar3 = true;
        }
      }
      iVar8 = -2;
      goto joined_r0x00169cea;
    }
  }
  if ((~uVar1 & 0x4020) != 0) {
    return -2;
  }
  local_631 = -1;
  local_624 = 0;
  astarisk_index_00 = write_len;
  wally_bzero(&local_618,0xc0);
  wally_bzero(&local_4f8,0xc0);
  iVar4 = wally_base58_to_bytes(node->data,1,local_558,0x52,&local_630);
  if (iVar4 != 0) {
    bVar3 = false;
    iVar8 = iVar4;
    goto joined_r0x00169cea;
  }
  iVar8 = -2;
  if (0x52 < local_630) {
LAB_00169d12:
    iVar4 = 0;
    bVar3 = false;
    goto joined_r0x00169cea;
  }
  iVar4 = bip32_key_unserialize(local_558,local_630,&local_618);
  if (iVar4 == 0) {
    iVar2 = node->kind;
    if ((local_618.version == 0x488ade4 && iVar2 == 0x14020) ||
       (local_618.version == 0x488b21e && iVar2 != 0x14020)) {
      iVar4 = 0;
      bVar3 = false;
      if (1 < node->network_type) goto joined_r0x00169cea;
      node->network_type = 1;
    }
    else {
      if ((node->network_type & 0xfffffffd) != 0) goto LAB_00169d12;
      node->network_type = 2;
    }
    path = node->derive_path;
    if ((path == (char *)0x0) || (*path == '\0')) {
LAB_00169f0e:
      if (node->is_xonly_key == true) {
        *(ulong *)(script + 0x10) = CONCAT17(local_618.pub_key[0x18],local_618.pub_key._17_7_);
        *(ulong *)(script + 0x18) = CONCAT17(local_618.pub_key[0x20],local_618.pub_key._25_7_);
        *(ulong *)script = CONCAT17(local_618.pub_key[8],local_618.pub_key._1_7_);
        *(ulong *)(script + 8) = CONCAT17(local_618.pub_key[0x10],local_618.pub_key._9_7_);
        sVar7 = 0x20;
      }
      else {
        script[0x20] = local_618.pub_key[0x20];
        *(ulong *)(script + 0x10) = CONCAT71(local_618.pub_key._17_7_,local_618.pub_key[0x10]);
        *(ulong *)(script + 0x18) = CONCAT71(local_618.pub_key._25_7_,local_618.pub_key[0x18]);
        *(ulong *)script = CONCAT71(local_618.pub_key._1_7_,local_618.pub_key[0]);
        *(ulong *)(script + 8) = CONCAT71(local_618.pub_key._9_7_,local_618.pub_key[8]);
        sVar7 = 0x21;
      }
      *write_len = sVar7;
      bVar3 = true;
      iVar4 = 0;
      goto joined_r0x00169cea;
    }
    iVar4 = convert_bip32_path_to_array
                      (path,&local_438,(uint)(iVar2 == 0x14020),SUB81(&local_624,0),
                       (uint32_t *)&local_631,(int8_t *)astarisk_index_00);
    if (iVar4 == 0) {
      if (-1 < (long)local_631) {
        (&local_438)[local_631] = (&local_438)[local_631] | derive_child_num;
      }
      iVar4 = bip32_key_from_parent_path(&local_618,&local_438,(ulong)local_624,1,&local_4f8);
      if (iVar4 == 0) {
        memcpy(&local_618,&local_4f8,0xc0);
        goto LAB_00169f0e;
      }
    }
  }
  bVar3 = false;
  iVar8 = iVar4;
joined_r0x00169cea:
  if (bVar3) {
    return iVar4;
  }
  return iVar8;
}

Assistant:

static int generate_script_from_miniscript(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    uint32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t output_len = 0;
    size_t len;
    size_t index;
    size_t table_idx;
    size_t max;
    const struct miniscript_wrapper_item_t *item = NULL;

    if (node->info) {
        output_len = *write_len;
        ret = node->info->generate_function(node, parent, derive_child_num, script,
                                            script_len, &output_len);
        if (ret != WALLY_OK)
            return ret;

        if (node->wrapper != 0) {
            /* back from wrapper string */
            max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
            len = strlen(node->wrapper_str);
            for (index = len; index > 0; --index) {
                item = NULL;
                for (table_idx = 0; table_idx < max; ++table_idx) {
                    if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                        item = &miniscript_wrapper_table[table_idx];
                        break;
                    }
                }
                if (!item) {
                    return WALLY_EINVAL;
                }

                ret = item->generate_function(script, script_len, &output_len);
                if (ret != WALLY_OK)
                    return ret;
            }
        }
        *write_len = output_len;
        return ret;
    }

    /* value data */
    if ((node->kind & DESCRIPTOR_KIND_RAW) || (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
        ret = wally_hex_to_bytes(node->data, script, script_len, write_len);
        if (((ret == WALLY_OK)) && (node->kind == DESCRIPTOR_KIND_PUBLIC_KEY)) {
            if (*write_len == EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
                node->is_uncompress_key = true;
            else if (*write_len == XONLY_PUBLIC_KEY_LEN)
                node->is_xonly_key = true;
        }
    } else if (node->kind == DESCRIPTOR_KIND_NUMBER) {
        ret = generate_script_from_number(node->number, parent, script, script_len, write_len);
    } else if ((node->kind == DESCRIPTOR_KIND_BASE58) || (node->kind == DESCRIPTOR_KIND_BECH32)) {
        ret = analyze_miniscript_addr(node->data, NULL, NULL, NULL, script, script_len, write_len);
    } else if (node->kind == DESCRIPTOR_KIND_PRIVATE_KEY) {
        unsigned char privkey[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
        unsigned char pubkey[EC_PUBLIC_KEY_LEN];
        if (script_len < EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
            return WALLY_EINVAL;

        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM, privkey,
                                    sizeof(privkey), &output_len);
        if ((ret == WALLY_OK) && (output_len < EC_PRIVATE_KEY_LEN + 1))
            return WALLY_EINVAL;

        ret = wally_ec_public_key_from_private_key(&privkey[1], EC_PRIVATE_KEY_LEN,
                                                   pubkey, sizeof(pubkey));
        if (ret == WALLY_OK) {
            if (privkey[0] == WALLY_ADDRESS_VERSION_WIF_MAINNET) {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_MAINNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
            } else {
                if ((node->network_type != 0) && (node->network_type != WALLY_NETWORK_BITCOIN_TESTNET))
                    return WALLY_EINVAL;
                node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
            }
        }
        if (ret == WALLY_OK) {
            if ((output_len == EC_PRIVATE_KEY_LEN + 2) && (privkey[EC_PRIVATE_KEY_LEN + 1] == 1)) {
                if (node->is_xonly_key) {
                    memcpy(script, &pubkey[1], XONLY_PUBLIC_KEY_LEN);
                    *write_len = XONLY_PUBLIC_KEY_LEN;
                } else {
                    memcpy(script, pubkey, EC_PUBLIC_KEY_LEN);
                    *write_len = EC_PUBLIC_KEY_LEN;
                }
            } else {
                ret = wally_ec_public_key_decompress(pubkey, sizeof(pubkey), script,
                                                     EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
                if (ret == WALLY_OK) {
                    *write_len = EC_PUBLIC_KEY_UNCOMPRESSED_LEN;
                    node->is_uncompress_key = true;
                }
            }
        }
    } else if ((node->kind & DESCRIPTOR_KIND_BIP32) == DESCRIPTOR_KIND_BIP32) {
        unsigned char bip32_serialized[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
        struct ext_key extkey;
        struct ext_key derive_extkey;
        uint32_t bip32_array[DESCRIPTOR_BIP32_PATH_NUM_MAX];
        int8_t astarisk_index = -1;
        uint32_t count = 0;

        wally_bzero(&extkey, sizeof(struct ext_key));
        wally_bzero(&derive_extkey, sizeof(struct ext_key));
        ret = wally_base58_to_bytes(node->data, BASE58_FLAG_CHECKSUM,
                                    bip32_serialized, sizeof(bip32_serialized), &output_len);
        if (ret != WALLY_OK)
            return ret;
        if (output_len > sizeof(bip32_serialized))
            return WALLY_EINVAL;

        ret = bip32_key_unserialize(bip32_serialized, output_len, &extkey);
        if (ret != WALLY_OK)
            return ret;

        if (((node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PRIVATE)) ||
            ((node->kind != DESCRIPTOR_KIND_BIP32_PRIVATE_KEY) && (extkey.version == BIP32_VER_MAIN_PUBLIC))) {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_MAINNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_MAINNET;
        } else {
            if (node->network_type != 0 && node->network_type != WALLY_NETWORK_BITCOIN_TESTNET) {
                return WALLY_EINVAL;
            }
            node->network_type = WALLY_NETWORK_BITCOIN_TESTNET;
        }

        if (node->derive_path && node->derive_path[0] != '\0') {
            ret = convert_bip32_path_to_array(node->derive_path, bip32_array,
                                              DESCRIPTOR_BIP32_PATH_NUM_MAX,
                                              (node->kind == DESCRIPTOR_KIND_BIP32_PRIVATE_KEY),
                                              &count, &astarisk_index);
            if (ret != WALLY_OK)
                return ret;

            if (astarisk_index >= 0)
                bip32_array[astarisk_index] |= derive_child_num;

            ret = bip32_key_from_parent_path(&extkey, bip32_array, count,
                                             BIP32_FLAG_KEY_PUBLIC, &derive_extkey);
            if (ret != WALLY_OK)
                return ret;

            memcpy(&extkey, &derive_extkey, sizeof(extkey));
        }
        if (node->is_xonly_key) {
            memcpy(script, &extkey.pub_key[1], XONLY_PUBLIC_KEY_LEN);
            *write_len = XONLY_PUBLIC_KEY_LEN;
        } else {
            memcpy(script, extkey.pub_key, EC_PUBLIC_KEY_LEN);
            *write_len = EC_PUBLIC_KEY_LEN;
        }
    } else {
        return WALLY_EINVAL;
    }

    return ret;
}